

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O0

void __thiscall APITests::test_multiple_outputs1(APITests *this)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  vector<int,_std::allocator<int>_> *in_RDI;
  vector<int,_std::allocator<int>_> channels;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 uVar2;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff50;
  vector<int,_std::allocator<int>_> *this_00;
  iterator in_stack_ffffffffffffff58;
  iterator piVar3;
  size_type in_stack_ffffffffffffff60;
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 *local_78;
  undefined8 local_70;
  vector local_68 [48];
  undefined4 local_38;
  undefined4 local_34;
  undefined4 *local_30;
  undefined8 local_28;
  vector local_20 [32];
  
  GPIO::setmode(BOARD);
  local_38 = *(undefined4 *)
              &in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
  local_34 = *(undefined4 *)
              &in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  local_30 = &local_38;
  local_28 = 2;
  std::allocator<int>::allocator((allocator<int> *)0x1404ba);
  __l._M_len = in_stack_ffffffffffffff60;
  __l._M_array = in_stack_ffffffffffffff58;
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffff50,__l,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  std::allocator<int>::~allocator((allocator<int> *)0x1404eb);
  GPIO::setup(local_20,OUT,-1);
  local_80 = 1;
  local_7c = 0;
  local_78 = &local_80;
  local_70 = 2;
  std::allocator<int>::allocator((allocator<int> *)0x140536);
  __l_00._M_len = in_stack_ffffffffffffff60;
  __l_00._M_array = in_stack_ffffffffffffff58;
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffff50,__l_00,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  GPIO::output(local_20,local_68);
  std::vector<int,_std::allocator<int>_>::~vector(in_RDI);
  std::allocator<int>::~allocator((allocator<int> *)0x140582);
  uVar1 = 0;
  uVar2 = 1;
  this_00 = (vector<int,_std::allocator<int>_> *)&stack0xffffffffffffff48;
  piVar3 = (iterator)0x2;
  std::allocator<int>::allocator((allocator<int> *)0x1405b4);
  __l_01._M_len = in_stack_ffffffffffffff60;
  __l_01._M_array = piVar3;
  std::vector<int,_std::allocator<int>_>::vector
            (this_00,__l_01,(allocator_type *)CONCAT44(uVar2,uVar1));
  GPIO::output(local_20,(vector *)&stack0xffffffffffffff60);
  std::vector<int,_std::allocator<int>_>::~vector(in_RDI);
  std::allocator<int>::~allocator((allocator<int> *)0x1405f7);
  GPIO::cleanup();
  std::vector<int,_std::allocator<int>_>::~vector(in_RDI);
  return;
}

Assistant:

void test_multiple_outputs1()
    {
        GPIO::setmode(GPIO::BOARD);
        std::vector<int> channels = {pin_data.out_a, pin_data.out_b};
        GPIO::setup(channels, GPIO::OUT);
        GPIO::output(channels, {GPIO::HIGH, GPIO::LOW});
        GPIO::output(channels, {GPIO::LOW, GPIO::HIGH});
        GPIO::cleanup();
    }